

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polygon.cc
# Opt level: O0

void __thiscall
S2Polygon::Init(S2Polygon *this,unique_ptr<S2Loop,_std::default_delete<S2Loop>_> *loop)

{
  bool bVar1;
  pointer this_00;
  unique_ptr<S2Loop,_std::default_delete<S2Loop>_> *loop_local;
  S2Polygon *this_local;
  
  ClearLoops(this);
  this_00 = std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>::operator->(loop);
  bVar1 = S2Loop::is_empty(this_00);
  if (bVar1) {
    InitLoopProperties(this);
  }
  else {
    std::
    vector<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
    ::push_back(&this->loops_,loop);
    InitOneLoop(this);
  }
  return;
}

Assistant:

void S2Polygon::Init(unique_ptr<S2Loop> loop) {
  // We don't allow empty loops in the other Init() methods because deleting
  // them changes the number of loops, which is awkward to handle.
  ClearLoops();
  if (loop->is_empty()) {
    InitLoopProperties();
  } else {
    loops_.push_back(std::move(loop));
    InitOneLoop();
  }
}